

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::Action
          (Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)> *this,
          ActionInterface<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)> *impl)

{
  __shared_ptr<testing::ActionInterface<ot::commissioner::Error(ot::commissioner::SecurityPolicy_const&)>,(__gnu_cxx::_Lock_policy)2>
  local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  __shared_ptr<testing::ActionInterface<ot::commissioner::Error(ot::commissioner::SecurityPolicy_const&)>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<testing::ActionInterface<ot::commissioner::Error(ot::commissioner::SecurityPolicy_const&)>,void>
            (local_20,impl);
  std::function<ot::commissioner::Error(ot::commissioner::SecurityPolicy_const&)>::
  function<testing::Action<ot::commissioner::Error(ot::commissioner::SecurityPolicy_const&)>::ActionAdapter,void>
            ((function<ot::commissioner::Error(ot::commissioner::SecurityPolicy_const&)> *)this,
             (ActionAdapter *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}